

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O0

QVariant * __thiscall QAssociativeIterable::value(QAssociativeIterable *this,QVariant *key)

{
  long lVar1;
  bool bVar2;
  void *container;
  QMetaAssociation *this_00;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  void *keyData;
  QVariant *result;
  QMetaType mappedMetaType;
  QMetaAssociation meta;
  QVariantTypeCoercer coercer;
  QMetaType *in_stack_fffffffffffffef8;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffff00;
  QVariant *in_stack_ffffffffffffff08;
  QVariant *in_stack_ffffffffffffff10;
  QMetaType in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QIterable<QMetaAssociation>::metaContainer(in_stack_ffffffffffffff00);
  QMetaAssociation::mappedMetaType((QMetaAssociation *)in_stack_ffffffffffffff00);
  QtPrivate::QVariantTypeCoercer::QVariantTypeCoercer((QVariantTypeCoercer *)0x333e87);
  QMetaAssociation::keyMetaType((QMetaAssociation *)in_stack_ffffffffffffff00);
  container = QtPrivate::QVariantTypeCoercer::coerce
                        ((QVariantTypeCoercer *)in_stack_ffffffffffffff18.d_ptr,
                         in_stack_ffffffffffffff10,(QMetaType *)in_stack_ffffffffffffff08);
  QMetaType::fromType<QVariant>();
  bVar2 = ::operator==((QMetaType *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (bVar2) {
    *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant((QVariant *)0x333f48);
    QIterable<QMetaAssociation>::constIterable((QIterable<QMetaAssociation> *)0x333f52);
    QMetaAssociation::mappedAtKey
              ((QMetaAssociation *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff18,in_stack_ffffffffffffff00);
    QIterable<QMetaAssociation>::constIterable((QIterable<QMetaAssociation> *)0x33403b);
    this_00 = (QMetaAssociation *)::QVariant::data((QVariant *)in_stack_ffffffffffffff00);
    QMetaAssociation::mappedAtKey
              (this_00,container,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  QtPrivate::QVariantTypeCoercer::~QVariantTypeCoercer((QVariantTypeCoercer *)0x3340da);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QVariant QAssociativeIterable::value(const QVariant &key) const
{
    const QMetaAssociation meta = metaContainer();
    const QMetaType mappedMetaType = meta.mappedMetaType();

    QtPrivate::QVariantTypeCoercer coercer;
    const void *keyData = coercer.coerce(key, meta.keyMetaType());

    if (mappedMetaType == QMetaType::fromType<QVariant>()) {
        QVariant result;
        meta.mappedAtKey(constIterable(), keyData, &result);
        return result;
    }

    QVariant result(mappedMetaType);
    meta.mappedAtKey(constIterable(), keyData, result.data());
    return result;
}